

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O1

void dirSAVECPR(void)

{
  byte *__ptr;
  bool bVar1;
  char cVar2;
  int iVar3;
  FILE *__s;
  size_t sVar4;
  CDevicePage *pCVar5;
  long lVar6;
  int num;
  ulong uVar7;
  uint uVar8;
  aint val;
  FILE *ff;
  path fnaam;
  undefined8 local_80;
  undefined4 local_78;
  long local_70 [2];
  FILE *local_60;
  path local_58;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  bVar1 = IsAmstradPLUSDevice(DeviceID);
  if (!bVar1) {
    Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode",(char *)0x0,SUPPRESS);
    return;
  }
  GetOutputFileName_abi_cxx11_(&local_58,&lp);
  cVar2 = std::filesystem::__cxx11::path::has_filename();
  if (cVar2 == '\0') {
    Error("[SAVECPR] CPR file name is empty",(char *)0x0,SUPPRESS);
  }
  else {
    bVar1 = anyComma(&lp);
    uVar8 = 0x20;
    if (bVar1) {
      iVar3 = SkipBlanks();
      if (iVar3 != 0) {
        Error("[SAVECPR] only a size from 1 (16KiB) to 32 (512KiB) is allowed",(char *)0x0,SUPPRESS)
        ;
      }
      iVar3 = ParseExpression(&lp,(aint *)&local_80);
      uVar8 = 0x20;
      if (iVar3 == 0) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        uVar8 = (uint)local_80;
        if ((uint)local_80 - 0x21 < 0xffffffe0) {
          bVar1 = false;
          Error("[SAVECPR] only a size from 1 (16KiB) to 32 (512KiB) is allowed",(char *)0x0,
                SUPPRESS);
          uVar8 = 0x20;
        }
      }
      if (!bVar1) goto LAB_00114130;
    }
    __s = (FILE *)SJ_fopen(&local_58,"wb");
    local_60 = __s;
    if (__s == (FILE *)0x0) {
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,local_58._M_pathname._M_dataplus._M_p,
                 local_58._M_pathname._M_dataplus._M_p + local_58._M_pathname._M_string_length);
      Error("[SAVECPR] Error opening file for write",(char *)local_80,PASS3);
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
    }
    else {
      local_80 = (long *)0x2020202046464952;
      local_78 = 0x21534d41;
      iVar3 = uVar8 * 0x4008 + 4;
      lVar6 = 4;
      do {
        *(char *)((long)&local_80 + lVar6) = (char)iVar3;
        iVar3 = iVar3 >> 8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      sVar4 = fwrite(&local_80,1,0xc,__s);
      if (sVar4 == 0xc) {
        if (0 < (int)uVar8) {
          uVar7 = 0;
          do {
            num = (int)uVar7;
            cVar2 = (char)(uVar7 / 10);
            local_80 = (long *)(CONCAT44(local_80._4_4_,
                                         CONCAT13((char)uVar7 + (cVar2 + (char)(uVar7 / 10)) * -5,
                                                  CONCAT12(cVar2 + (char)((uVar7 / 10) * 0x1999999a
                                                                         >> 0x20) * -10,0x6263))) |
                               0x30300000);
            pCVar5 = CDevice::GetPage(Device,num);
            iVar3 = pCVar5->Size;
            lVar6 = 4;
            do {
              *(char *)((long)&local_80 + lVar6) = (char)iVar3;
              iVar3 = iVar3 >> 8;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 8);
            sVar4 = fwrite(&local_80,1,8,__s);
            if (sVar4 != 8) goto LAB_001140bf;
            pCVar5 = CDevice::GetPage(Device,num);
            __ptr = pCVar5->RAM;
            pCVar5 = CDevice::GetPage(Device,num);
            sVar4 = fwrite(__ptr,1,(long)pCVar5->Size,__s);
            pCVar5 = CDevice::GetPage(Device,num);
            if (pCVar5->Size != (int)sVar4) goto LAB_001140bf;
            uVar7 = (ulong)(num + 1U);
          } while (num + 1U != uVar8);
        }
        fclose(__s);
        goto LAB_00114130;
      }
LAB_001140bf:
      anon_unknown.dwarf_22443::writeError(&local_58,(FILE **)&local_60);
    }
    Error("[SAVECPR] Error writing file (Disk full?)",(char *)0x0,IF_FIRST);
  }
LAB_00114130:
  std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

void dirSAVECPR() {
	if (pass != LASTPASS) {
		SkipToEol(lp);
		return;
	}
	if (!IsAmstradPLUSDevice(DeviceID)) {
		Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode", NULL, SUPPRESS);
		return;
	}
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	if (!fnaam.has_filename()) {
		Error("[SAVECPR] CPR file name is empty", NULL, SUPPRESS);
		return;
	}
	int cprSize = 32;
	if (anyComma(lp)) {
		if (SkipBlanks()) Error(err_txt_size, NULL, SUPPRESS);	// return will happen on ParseExpression
		aint val;
		if (!ParseExpression(lp, val)) return;
		if ((val < 1) || (val > 32)) {
			Error(err_txt_size, NULL, SUPPRESS);
			return;
		}
		cprSize = val;
	}
	if (!SaveCPR(fnaam, cprSize)) Error("[SAVECPR] Error writing file (Disk full?)", NULL, IF_FIRST);
}